

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

mp_int * ecdsa_signing_exponent_from_data(ec_curve *curve,ecsign_extra *extra,ptrlen data)

{
  ssh_hash *h_00;
  mp_int *x;
  size_t sVar1;
  size_t sVar2;
  mp_int *pmVar3;
  ptrlen bytes;
  mp_int *toret;
  size_t shift;
  size_t nbits;
  size_t zbits;
  mp_int *z;
  ssh_hash *h;
  uchar hash [114];
  ecsign_extra *extra_local;
  ec_curve *curve_local;
  ptrlen data_local;
  
  h_00 = ssh_hash_new(extra->hash);
  BinarySink_put_datapl(h_00->binarysink_,data);
  ssh_hash_final(h_00,(uchar *)&h);
  bytes = make_ptrlen(&h,extra->hash->hlen);
  x = mp_from_bytes_be(bytes);
  sVar1 = mp_get_nbits(x);
  sVar2 = mp_get_nbits((curve->field_6).w.G_order);
  pmVar3 = mp_rshift_safe(x,((long)(sVar1 - sVar2) >> 0x3f ^ 0xffffffffffffffffU) & sVar1 - sVar2);
  mp_free(x);
  return pmVar3;
}

Assistant:

static mp_int *ecdsa_signing_exponent_from_data(
    const struct ec_curve *curve, const struct ecsign_extra *extra,
    ptrlen data)
{
    /* Hash the data being signed. */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    put_datapl(h, data);
    ssh_hash_final(h, hash);

    /*
     * Take the leftmost b bits of the hash of the signed data (where
     * b is the number of bits in order(G)), interpreted big-endian.
     */
    mp_int *z = mp_from_bytes_be(make_ptrlen(hash, extra->hash->hlen));
    size_t zbits = mp_get_nbits(z);
    size_t nbits = mp_get_nbits(curve->w.G_order);
    size_t shift = zbits - nbits;
    /* Bound the shift count below at 0, using bit twiddling to avoid
     * a conditional branch */
    shift &= ~-(shift >> (CHAR_BIT * sizeof(size_t) - 1));
    mp_int *toret = mp_rshift_safe(z, shift);
    mp_free(z);

    return toret;
}